

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O0

QString * QtPrivate::QStringList_join(QStringList *list,QLatin1StringView sep)

{
  QLatin1StringView s;
  bool bVar1;
  const_iterator *this;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *result;
  const_iterator it;
  const_iterator end;
  QString *in_stack_ffffffffffffff38;
  QList<QString> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  qsizetype in_stack_ffffffffffffff58;
  QStringList *in_stack_ffffffffffffff60;
  QString *pQVar2;
  qsizetype in_stack_ffffffffffffff68;
  const_iterator local_28;
  const_iterator local_20;
  QLatin1String local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x54b3bd);
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x54b3c7);
  if (!bVar1) {
    QLatin1String::size(&local_18);
    accumulatedSize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    QString::reserve((QString *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff68);
    pQVar2 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = QList<QString>::end(in_stack_ffffffffffffff40);
    local_28.i = pQVar2;
    local_28 = QList<QString>::begin(in_stack_ffffffffffffff40);
    QList<QString>::const_iterator::operator*(&local_28);
    QString::operator+=((QString *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    while( true ) {
      this = QList<QString>::const_iterator::operator++(&local_28);
      bVar1 = QList<QString>::const_iterator::operator!=(this,local_20);
      if (!bVar1) break;
      s.m_size._7_1_ = bVar1;
      s.m_size._0_7_ = in_stack_ffffffffffffff50;
      s.m_data = (char *)this;
      QString::operator+=(in_stack_ffffffffffffff38,s);
      QList<QString>::const_iterator::operator*(&local_28);
      QString::operator+=((QString *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QtPrivate::QStringList_join(const QStringList &list, QLatin1StringView sep)
{
    QString result;
    if (!list.isEmpty()) {
        result.reserve(accumulatedSize(list, sep.size()));
        const auto end = list.end();
        auto it = list.begin();
        result += *it;
        while (++it != end) {
            result += sep;
            result += *it;
        }
    }
    return result;
}